

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall iu_Matcher_x_iutest_x_TypedEq_Test::Body(iu_Matcher_x_iutest_x_TypedEq_Test *this)

{
  int **v_00;
  AssertionResult *in_R8;
  int v;
  int *local_238;
  string local_230;
  string local_210;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  undefined1 local_198 [16];
  int *local_188 [47];
  
  v = 0;
  local_198._0_8_ = &PTR__IMatcher_00225390;
  local_188[0] = (int *)CONCAT44(local_188[0]._4_4_,1);
  local_1c8.m_message._M_dataplus._M_p._0_4_ = 1;
  local_198._8_8_ = local_188;
  iutest::detail::EqMatcher<int>::operator()
            (&iutest_ar,(EqMatcher<int> *)local_198,(int *)&local_1c8);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    local_238 = (int *)CONCAT44(local_238._4_4_,1);
    iutest::PrintToString<int>(&local_230,(int *)&local_238);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_210,(detail *)local_230._M_dataplus._M_p,"TypedEq<int>(1)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x6a,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198._0_8_ = &PTR__IMatcher_002253d0;
  local_1c8.m_message._M_dataplus._M_p = (pointer)&v;
  local_198._8_8_ = local_188;
  local_188[0] = &v;
  iutest::detail::EqMatcher<int*>::operator()
            (&iutest_ar,(EqMatcher<int*> *)local_198,(int **)&local_1c8);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    local_238 = &v;
    iutest::PrintToString<int*>(&local_230,(iutest *)&local_238,v_00);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_210,(detail *)local_230._M_dataplus._M_p,"TypedEq<int*>(&v)",
               (char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x6b,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(Matcher, TypedEq)
{
    int v=0;
    IUTEST_EXPECT_THAT(1, TypedEq<int>(1));
    IUTEST_EXPECT_THAT(&v, TypedEq<int*>(&v));
}